

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack9(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x17;
    out_local[1] = *in_local >> 0xe & 0x1ff;
    out_local[2] = *in_local >> 5 & 0x1ff;
    out_local[3] = (*in_local & 0x1f) << 4;
    out_local[3] = in_local[1] >> 0x1c | out_local[3];
    out_local[4] = in_local[1] >> 0x13 & 0x1ff;
    out_local[5] = in_local[1] >> 10 & 0x1ff;
    out_local[6] = in_local[1] >> 1 & 0x1ff;
    out_local[7] = (in_local[1] & 1) << 8;
    out_local[7] = in_local[2] >> 0x18 | out_local[7];
    out_local[8] = in_local[2] >> 0xf & 0x1ff;
    out_local[9] = in_local[2] >> 6 & 0x1ff;
    out_local[10] = (in_local[2] & 0x3f) << 3;
    out_local[10] = in_local[3] >> 0x1d | out_local[10];
    out_local[0xb] = in_local[3] >> 0x14 & 0x1ff;
    out_local[0xc] = in_local[3] >> 0xb & 0x1ff;
    out_local[0xd] = in_local[3] >> 2 & 0x1ff;
    out_local[0xe] = (in_local[3] & 3) << 7;
    out_local[0xe] = in_local[4] >> 0x19 | out_local[0xe];
    out_local[0xf] = in_local[4] >> 0x10 & 0x1ff;
    out_local[0x10] = in_local[4] >> 7 & 0x1ff;
    out_local[0x11] = (in_local[4] & 0x7f) << 2;
    out_local[0x11] = in_local[5] >> 0x1e | out_local[0x11];
    out_local[0x12] = in_local[5] >> 0x15 & 0x1ff;
    out_local[0x13] = in_local[5] >> 0xc & 0x1ff;
    out_local[0x14] = in_local[5] >> 3 & 0x1ff;
    out_local[0x15] = (in_local[5] & 7) << 6;
    out_local[0x15] = in_local[6] >> 0x1a | out_local[0x15];
    out_local[0x16] = in_local[6] >> 0x11 & 0x1ff;
    out_local[0x17] = in_local[6] >> 8 & 0x1ff;
    out_local[0x18] = (in_local[6] & 0xff) << 1;
    out_local[0x18] = in_local[7] >> 0x1f | out_local[0x18];
    out_local[0x19] = in_local[7] >> 0x16 & 0x1ff;
    out_local[0x1a] = in_local[7] >> 0xd & 0x1ff;
    out_local[0x1b] = in_local[7] >> 4 & 0x1ff;
    out_local[0x1c] = (in_local[7] & 0xf) << 5;
    out_local[0x1c] = in_local[8] >> 0x1b | out_local[0x1c];
    out_local[0x1d] = in_local[8] >> 0x12 & 0x1ff;
    out_local[0x1e] = in_local[8] >> 9 & 0x1ff;
    out_local[0x1f] = in_local[8] & 0x1ff;
    out_local = out_local + 0x20;
    in_local = in_local + 9;
  }
  return;
}

Assistant:

void __vseblocks_unpack9(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 9, --bs) {
    out[0] = in[0] >> 23;
    out[1] = (in[0] >> 14) & 0x01ff;
    out[2] = (in[0] >> 5) & 0x01ff;
    out[3] = (in[0] << 4) & 0x01ff;
    out[3] |= in[1] >> 28;
    out[4] = (in[1] >> 19) & 0x01ff;
    out[5] = (in[1] >> 10) & 0x01ff;
    out[6] = (in[1] >> 1) & 0x01ff;
    out[7] = (in[1] << 8) & 0x01ff;
    out[7] |= in[2] >> 24;
    out[8] = (in[2] >> 15) & 0x01ff;
    out[9] = (in[2] >> 6) & 0x01ff;
    out[10] = (in[2] << 3) & 0x01ff;
    out[10] |= in[3] >> 29;
    out[11] = (in[3] >> 20) & 0x01ff;
    out[12] = (in[3] >> 11) & 0x01ff;
    out[13] = (in[3] >> 2) & 0x01ff;
    out[14] = (in[3] << 7) & 0x01ff;
    out[14] |= in[4] >> 25;
    out[15] = (in[4] >> 16) & 0x01ff;
    out[16] = (in[4] >> 7) & 0x01ff;
    out[17] = (in[4] << 2) & 0x01ff;
    out[17] |= in[5] >> 30;
    out[18] = (in[5] >> 21) & 0x01ff;
    out[19] = (in[5] >> 12) & 0x01ff;
    out[20] = (in[5] >> 3) & 0x01ff;
    out[21] = (in[5] << 6) & 0x01ff;
    out[21] |= in[6] >> 26;
    out[22] = (in[6] >> 17) & 0x01ff;
    out[23] = (in[6] >> 8) & 0x01ff;
    out[24] = (in[6] << 1) & 0x01ff;
    out[24] |= in[7] >> 31;
    out[25] = (in[7] >> 22) & 0x01ff;
    out[26] = (in[7] >> 13) & 0x01ff;
    out[27] = (in[7] >> 4) & 0x01ff;
    out[28] = (in[7] << 5) & 0x01ff;
    out[28] |= in[8] >> 27;
    out[29] = (in[8] >> 18) & 0x01ff;
    out[30] = (in[8] >> 9) & 0x01ff;
    out[31] = in[8] & 0x01ff;
  }
}